

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pl_function.cc
# Opt level: O0

int f(uchar *data,size_t len,void *udata)

{
  ostream *poVar1;
  Count *c;
  void *udata_local;
  size_t len_local;
  uchar *data_local;
  
  *(int *)udata = *udata + 1;
  poVar1 = std::operator<<((ostream *)&std::cout,"got ");
  poVar1 = std::operator<<(poVar1,data);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,len);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  data_local._4_4_ = (uint)(*udata == 3);
  return data_local._4_4_;
}

Assistant:

int
f(unsigned char const* data, size_t len, void* udata)
{
    auto c = reinterpret_cast<Count*>(udata);
    ++c->count;
    std::cout << "got " << data << "(" << len << ")" << std::endl;
    if (c->count == 3) {
        return 1;
    }
    return 0;
}